

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallTargetGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  cmLocalGenerator *lg;
  char *pcVar1;
  cmGeneratorExpression ge;
  allocator local_71;
  undefined1 local_70 [8];
  undefined1 local_68 [32];
  string local_48;
  
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_68);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&local_48,(cmListFileBacktrace *)local_68);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_68);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,&local_48);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_68[0x10] = '\0';
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_70,lg,config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_68);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_71);
  std::__cxx11::string::~string((string *)local_68);
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->Target->GetLocalGenerator(), config);
}